

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ucvector_reserve(ucvector *p,size_t allocsize)

{
  void *pvVar1;
  void *in_RSI;
  undefined8 *in_RDI;
  void *data;
  size_t newsize;
  size_t in_stack_ffffffffffffffc8;
  
  if ((void *)in_RDI[2] < in_RSI) {
    if (in_RSI <= (void *)(in_RDI[2] * 2)) {
      in_RSI = (void *)((ulong)((long)in_RSI * 3) >> 1);
    }
    pvVar1 = lodepng_realloc(in_RSI,in_stack_ffffffffffffffc8);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    in_RDI[2] = in_RSI;
    *in_RDI = pvVar1;
  }
  return 1;
}

Assistant:

static unsigned ucvector_reserve(ucvector* p, size_t allocsize)
{
	if (allocsize > p->allocsize)
	{
		size_t newsize = (allocsize > p->allocsize * 2) ? allocsize : (allocsize * 3 / 2);
		void* data = lodepng_realloc(p->data, newsize);
		if (data)
		{
			p->allocsize = newsize;
			p->data = (unsigned char*)data;
		}
		else return 0; /*error: not enough memory*/
	}
	return 1;
}